

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEBody.cpp
# Opt level: O1

void __thiscall CEBody::CEBody(CEBody *this,CEBody *other,string *name)

{
  long lVar1;
  
  CESkyCoord::CESkyCoord(&this->super_CESkyCoord,&other->super_CESkyCoord);
  (this->super_CESkyCoord)._vptr_CESkyCoord = (_func_int **)&PTR__CEBody_001466c8;
  std::__cxx11::string::string((string *)&this->name_);
  init_members(this);
  copy_members(this,other);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    SetName(this,name);
  }
  return;
}

Assistant:

CEBody::CEBody(const CEBody&      other, 
               const std::string& name) :
    CESkyCoord(other)
{
    init_members();
    copy_members(other);

    // Set the name if it is not empty
    if (name.size() > 0) SetName(name);
}